

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vkBinaryRegistry.cpp
# Opt level: O0

deUint32 vk::BinaryRegistryDetail::anon_unknown_8::addAndCountNodes
                   (BinaryIndexNode *index,deUint32 baseOffset,SparseIndexNode *group)

{
  SparseIndexNode *group_00;
  deUint32 dVar1;
  size_type sVar2;
  const_reference ppSVar3;
  deUint32 subtreeSize;
  SparseIndexNode *child;
  size_t childNdx;
  deUint32 curOffset;
  deUint32 numLocalNodes;
  SparseIndexNode *group_local;
  deUint32 baseOffset_local;
  BinaryIndexNode *index_local;
  
  sVar2 = std::
          vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
          ::size(&group->children);
  childNdx._0_4_ = (uint)sVar2;
  for (child = (SparseIndexNode *)0x0; child < (SparseIndexNode *)(sVar2 & 0xffffffff);
      child = (SparseIndexNode *)((long)&child->word + 1)) {
    ppSVar3 = std::
              vector<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*,_std::allocator<vk::BinaryRegistryDetail::(anonymous_namespace)::SparseIndexNode_*>_>
              ::operator[](&group->children,(size_type)child);
    group_00 = *ppSVar3;
    dVar1 = addAndCountNodes(index + (uint)childNdx,baseOffset + (uint)childNdx,group_00);
    index[(long)child].word = group_00->word;
    if (dVar1 == 0) {
      index[(long)child].index = group_00->index;
    }
    else {
      index[(long)child].index = baseOffset + (uint)childNdx;
    }
    childNdx._0_4_ = dVar1 + (uint)childNdx;
  }
  return (uint)childNdx;
}

Assistant:

deUint32 addAndCountNodes (BinaryIndexNode* index, deUint32 baseOffset, const SparseIndexNode* group)
{
	const deUint32	numLocalNodes	= (deUint32)group->children.size();
	deUint32		curOffset		= numLocalNodes;

	// Must be normalized prior to construction of final index
	DE_ASSERT(group->children.empty() || group->children.back()->word == 0);

	for (size_t childNdx = 0; childNdx < numLocalNodes; childNdx++)
	{
		const SparseIndexNode*	child		= group->children[childNdx];
		const deUint32			subtreeSize	= addAndCountNodes(index+curOffset, baseOffset+curOffset, child);

		index[childNdx].word = child->word;

		if (subtreeSize == 0)
			index[childNdx].index = child->index;
		else
		{
			DE_ASSERT(child->index == 0);
			index[childNdx].index = baseOffset+curOffset;
		}

		curOffset += subtreeSize;
	}

	return curOffset;
}